

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O0

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
pushBack<pica::Particle<(pica::Dimension)3>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)3>_> *this,
          Particle<(pica::Dimension)3> particle)

{
  value_type *__x;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  int d_1;
  MomentumType p;
  int d;
  PositionType position;
  value_type *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  int local_4c;
  MomentumType local_48;
  double local_30;
  int local_24;
  PositionType local_20;
  
  Particle<(pica::Dimension)3>::getPosition
            (&local_20,(Particle<(pica::Dimension)3> *)&stack0x00000008);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    local_30 = Vector3<double>::operator[](&local_20,local_24);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  Particle<(pica::Dimension)3>::getP(&local_48,(Particle<(pica::Dimension)3> *)&stack0x00000008);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    Vector3<double>::operator[](&local_48,local_4c);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  __x = (value_type *)(in_RDI + 0x90);
  Particle<(pica::Dimension)3>::getFactor((Particle<(pica::Dimension)3> *)&stack0x00000008);
  std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffff60,__x);
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xa8);
  Particle<(pica::Dimension)3>::getGamma((Particle<(pica::Dimension)3> *)&stack0x00000008);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,__x);
  Particle<(pica::Dimension)3>::getType((Particle<(pica::Dimension)3> *)&stack0x00000008);
  std::vector<short,_std::allocator<short>_>::push_back
            ((vector<short,_std::allocator<short>_> *)this_00,(value_type_conflict2 *)__x);
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }